

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O1

bool __thiscall CChat::CompleteCommand(CChat *this)

{
  int iVar1;
  int iVar2;
  CCommand *pCVar3;
  bool bVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  char aBuf [128];
  char acStack_a8 [136];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (this->m_CommandManager).m_aCommands.num_elements;
  if (iVar1 != this->m_FilteredCount) {
    iVar2 = this->m_SelectedCommand;
    pCVar3 = (this->m_CommandManager).m_aCommands.list;
    if (pCVar3 != (CCommand *)0x0 && (iVar2 < iVar1 && -1 < iVar2)) {
      pcVar5 = str_find((this->m_Input).m_pStr," ");
      if (pcVar5 == (char *)0x0) {
        str_format(acStack_a8,0x80,"/%s ",pCVar3 + iVar2);
        CLineInput::Set(&this->m_Input,acStack_a8);
        bVar4 = true;
        goto LAB_00138862;
      }
    }
  }
  bVar4 = false;
LAB_00138862:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool CChat::CompleteCommand()
{
	if(m_CommandManager.CommandCount() - m_FilteredCount == 0)
		return false;

	const CCommandManager::CCommand *pCommand = m_CommandManager.GetCommand(m_SelectedCommand);
	if(!pCommand || str_find(m_Input.GetString(), " "))
		return false;

	// autocomplete command
	char aBuf[128];
	str_format(aBuf, sizeof(aBuf), "/%s ", pCommand->m_aName);

	m_Input.Set(aBuf);
	return true;
}